

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void print_atomname(LispPTR index)

{
  uint uVar1;
  DLword **ppDVar2;
  ushort uVar3;
  long lVar4;
  DLword *pDVar5;
  
  if ((index & 0xfff0000) == 0) {
    ppDVar2 = &AtomSpace;
    lVar4 = (ulong)(index * 5) << 2;
  }
  else {
    if ((index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)index);
    }
    ppDVar2 = &Lisp_world;
    lVar4 = (ulong)index * 2;
  }
  pDVar5 = *ppDVar2;
  print_package_name((uint)*(byte *)(lVar4 + (long)pDVar5 + 0x13));
  uVar1 = *(uint *)(lVar4 + (long)pDVar5) & 0xfffffff;
  uVar3 = (ushort)*(byte *)((ulong)(Lisp_world + uVar1) ^ 3);
  if (*(byte *)((ulong)(Lisp_world + uVar1) ^ 3) != 0) {
    pDVar5 = Lisp_world + uVar1;
    do {
      pDVar5 = (DLword *)((long)pDVar5 + 1);
      putchar((uint)*(byte *)((ulong)pDVar5 ^ 3));
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void print_atomname(LispPTR index)
/* atomindex */
{
  char *pname;
  DLword length;
  PNCell *pnptr;

  pnptr = (PNCell *)GetPnameCell(index);
  print_package_name(pnptr->pkg_index);
  pname = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);

  length = (DLword)GETBYTE(pname++);

  while (length > 0) {
    putchar(GETBYTE(pname++));
    length--;
  }

}